

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int PictureARGBToYUVA(WebPPicture *picture,WebPEncCSP colorspace,float dithering,
                     int use_iterative_conversion)

{
  uint in_ESI;
  WebPPicture *in_RDI;
  uint8_t *b;
  uint8_t *g;
  uint8_t *r;
  uint8_t *a;
  uint8_t *argb;
  float in_stack_000000e4;
  int in_stack_000000e8;
  int in_stack_000000ec;
  uint8_t *in_stack_000000f0;
  uint8_t *in_stack_000000f8;
  uint8_t *in_stack_00000100;
  uint8_t *in_stack_00000108;
  int in_stack_00000120;
  WebPPicture *in_stack_00000128;
  int local_4;
  
  if (in_RDI == (WebPPicture *)0x0) {
    local_4 = 0;
  }
  else if (in_RDI->argb == (uint32_t *)0x0) {
    local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_NULL_PARAMETER);
  }
  else if ((in_ESI & 3) == 0) {
    in_RDI->colorspace = WEBP_YUV420;
    local_4 = ImportYUVAFromRGBA(in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                                 in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,
                                 in_stack_000000e4,in_stack_00000120,in_stack_00000128);
  }
  else {
    local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  return local_4;
}

Assistant:

static int PictureARGBToYUVA(WebPPicture* picture, WebPEncCSP colorspace,
                             float dithering, int use_iterative_conversion) {
  if (picture == NULL) return 0;
  if (picture->argb == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  } else if ((colorspace & WEBP_CSP_UV_MASK) != WEBP_YUV420) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  } else {
    const uint8_t* const argb = (const uint8_t*)picture->argb;
    const uint8_t* const a = argb + CHANNEL_OFFSET(0);
    const uint8_t* const r = argb + CHANNEL_OFFSET(1);
    const uint8_t* const g = argb + CHANNEL_OFFSET(2);
    const uint8_t* const b = argb + CHANNEL_OFFSET(3);

    picture->colorspace = WEBP_YUV420;
    return ImportYUVAFromRGBA(r, g, b, a, 4, 4 * picture->argb_stride,
                              dithering, use_iterative_conversion, picture);
  }
}